

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O3

void libtorrent::dht::anon_unknown_20::get_mutable_item_callback
               (item *it,bool authoritative,
               shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx> *ctx,
               function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  data_type dVar1;
  undefined8 in_RAX;
  long lVar2;
  bool *pbVar3;
  undefined7 in_register_00000031;
  public_key *ppVar4;
  public_key *ppVar5;
  element_type *peVar6;
  bool bVar7;
  byte bVar8;
  undefined8 uStack_28;
  
  bVar8 = 0;
  peVar6 = (ctx->
           super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if ((int)CONCAT71(in_register_00000031,authoritative) == 0) {
    bVar7 = false;
  }
  else {
    peVar6->active_traversals = peVar6->active_traversals + -1;
    bVar7 = peVar6->active_traversals == 0;
  }
  uStack_28 = in_RAX;
  dVar1 = entry::type(&(peVar6->it).m_value);
  if ((dVar1 == undefined_t) && (dVar1 = entry::type(&it->m_value), dVar1 != undefined_t)) {
    peVar6 = (ctx->
             super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  }
  else {
    peVar6 = (ctx->
             super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if ((it->m_seq).value <= (peVar6->it).m_seq.value) {
      if (bVar7 == false) {
        return;
      }
      uStack_28 = CONCAT17(1,(undefined7)uStack_28);
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003acfc6;
      pbVar3 = (bool *)((long)&uStack_28 + 7);
      goto LAB_003acfb2;
    }
  }
  entry::operator=(&(peVar6->it).m_value,&it->m_value);
  ::std::__cxx11::string::_M_assign((string *)&(peVar6->it).m_salt);
  ppVar4 = &it->m_pk;
  ppVar5 = &(peVar6->it).m_pk;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)(ppVar5->bytes)._M_elems = *(undefined8 *)(ppVar4->bytes)._M_elems;
    ppVar4 = (public_key *)((long)ppVar4 + (ulong)bVar8 * -0x10 + 8);
    ppVar5 = (public_key *)((long)ppVar5 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  (peVar6->it).m_seq.value = (it->m_seq).value;
  (peVar6->it).m_mutable = it->m_mutable;
  uStack_28._0_7_ = CONCAT16(bVar7,(undefined6)uStack_28);
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_003acfc6:
    ::std::__throw_bad_function_call();
  }
  pbVar3 = (bool *)((long)&uStack_28 + 6);
LAB_003acfb2:
  (*f->_M_invoker)((_Any_data *)f,it,pbVar3);
  return;
}

Assistant:

void get_mutable_item_callback(item const& it, bool authoritative
		, std::shared_ptr<get_mutable_item_ctx> ctx
		, std::function<void(item const&, bool)> f)
	{
		TORRENT_ASSERT(it.is_mutable());
		if (authoritative) --ctx->active_traversals;
		authoritative = authoritative && ctx->active_traversals == 0;
		if ((ctx->it.empty() && !it.empty()) || (ctx->it.seq() < it.seq()))
		{
			ctx->it = it;
			f(it, authoritative);
		}
		else if (authoritative)
			f(it, authoritative);
	}